

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

void do_fp_imm(DisasContext_conflict1 *s,arg_rpri_esz *a,uint64_t imm,gen_helper_sve_fp2scalar *fn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_i64 scalar;
  TCGv_i64 temp;
  TCGContext_conflict1 *tcg_ctx;
  gen_helper_sve_fp2scalar *fn_local;
  uint64_t imm_local;
  arg_rpri_esz *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  scalar = tcg_const_i64_aarch64(tcg_ctx_00,imm);
  do_fp_scalar(s,a->rd,a->rn,a->pg,a->esz == 1,scalar,fn);
  tcg_temp_free_i64(tcg_ctx_00,scalar);
  return;
}

Assistant:

static void do_fp_imm(DisasContext *s, arg_rpri_esz *a, uint64_t imm,
                      gen_helper_sve_fp2scalar *fn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 temp = tcg_const_i64(tcg_ctx, imm);
    do_fp_scalar(s, a->rd, a->rn, a->pg, a->esz == MO_16, temp, fn);
    tcg_temp_free_i64(tcg_ctx, temp);
}